

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

Error asmjit::v1_14::Formatter::formatNode
                (String *sb,FormatOptions *formatOptions,BaseBuilder *builder,BaseNode *node)

{
  uint uVar1;
  CodeHolder *pCVar2;
  bool bVar3;
  Error EVar4;
  uint uVar5;
  size_t n;
  char *pcVar6;
  bool bVar7;
  FormatFlags FVar8;
  FormatOptions *pFVar9;
  ulong uVar10;
  ulong uVar11;
  ConstPoolNode *constPoolNode;
  
  pFVar9 = formatOptions;
  if ((*(int *)(node + 0x14) != 0) && ((formatOptions->_flags & kPositions) != kNone)) {
    pFVar9 = (FormatOptions *)0x1;
    EVar4 = String::_opFormat(sb,kAppend,"<%05u> ");
    if (EVar4 != 0) {
      return EVar4;
    }
  }
  uVar10 = (ulong)(byte)*sb;
  if (0x1e < uVar10) {
    uVar10 = *(ulong *)(sb + 8);
  }
  switch(node[0x10]) {
  case (BaseNode)0x1:
  case (BaseNode)0xf:
  case (BaseNode)0x12:
    EVar4 = (*(builder->super_BaseEmitter)._funcs.formatInstruction)
                      (sb,formatOptions->_flags,&builder->super_BaseEmitter,
                       (builder->super_BaseEmitter)._environment._arch,(BaseInst *)(node + 0x30),
                       (Operand_ *)(node + 0x40),SUB18(node[0x12],0));
    break;
  case (BaseNode)0x2:
    pCVar2 = (builder->super_BaseEmitter)._code;
    if (*(uint *)(node + 0x30) < *(uint *)&pCVar2->field_0xe0) {
      EVar4 = String::_opFormat(sb,kAppend,".section %s",
                                *(long *)(*(long *)&pCVar2->_sections +
                                         (ulong)*(uint *)(node + 0x30) * 8) + 0x20);
      break;
    }
    goto LAB_0011e664;
  case (BaseNode)0x3:
    EVar4 = formatLabel(sb,(FormatFlags)pFVar9,&builder->super_BaseEmitter,
                        *(uint32_t *)(node + 0x30));
    if (EVar4 != 0) {
      return EVar4;
    }
    pcVar6 = ":";
    goto LAB_0011e5e1;
  case (BaseNode)0x4:
    pcVar6 = "data";
    if (node[0x12] == (BaseNode)0x0) {
      pcVar6 = "code";
    }
    EVar4 = String::_opFormat(sb,kAppend,".align %u (%s)",(ulong)*(uint *)(node + 0x30),pcVar6);
    break;
  case (BaseNode)0x5:
    FVar8 = kMachineCode;
    EVar4 = String::_opChar(sb,kAppend,'.');
    if (EVar4 != 0) {
      return EVar4;
    }
    EVar4 = formatDataType(sb,FVar8,(builder->super_BaseEmitter)._environment._arch,
                           (TypeId)node[0x12]);
    if (EVar4 != 0) {
      return EVar4;
    }
    EVar4 = String::_opFormat(sb,kAppend," {Count=%zu Repeat=%zu TotalSize=%zu}",
                              *(long *)(node + 0x30),*(undefined8 *)(node + 0x38),
                              (ulong)(byte)node[0x13] * *(long *)(node + 0x30));
    break;
  case (BaseNode)0x6:
    FVar8 = kMachineCode;
    EVar4 = String::_opString(sb,kAppend,".label ",0xffffffffffffffff);
    if (EVar4 != 0) {
      return EVar4;
    }
    EVar4 = formatLabel(sb,FVar8,&builder->super_BaseEmitter,*(uint32_t *)(node + 0x30));
    break;
  case (BaseNode)0x7:
    FVar8 = kMachineCode;
    EVar4 = String::_opString(sb,kAppend,".label (",0xffffffffffffffff);
    if (EVar4 != 0) {
      return EVar4;
    }
    EVar4 = formatLabel(sb,FVar8,&builder->super_BaseEmitter,*(uint32_t *)(node + 0x30));
    if (EVar4 != 0) {
      return EVar4;
    }
    FVar8 = kMachineCode;
    EVar4 = String::_opString(sb,kAppend," - ",0xffffffffffffffff);
    if (EVar4 != 0) {
      return EVar4;
    }
    EVar4 = formatLabel(sb,FVar8,&builder->super_BaseEmitter,*(uint32_t *)(node + 0x34));
joined_r0x0011e5b5:
    if (EVar4 != 0) {
      return EVar4;
    }
    pcVar6 = ")";
    goto LAB_0011e5e1;
  case (BaseNode)0x8:
    EVar4 = String::_opFormat(sb,kAppend,"[ConstPool Size=%zu Alignment=%zu]",
                              *(undefined8 *)(node + 0x128),*(undefined8 *)(node + 0x130));
    break;
  case (BaseNode)0x9:
    EVar4 = String::_opFormat(sb,kAppend,"; %s",*(undefined8 *)(node + 0x28));
    return EVar4;
  case (BaseNode)0xa:
    pcVar6 = "[Sentinel]";
    if (node[0x12] == (BaseNode)0x1) {
      pcVar6 = "[FuncEnd]";
    }
LAB_0011e5e1:
    EVar4 = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
    break;
  default:
    EVar4 = String::_opFormat(sb,kAppend,"[UserNode:%u]",(ulong)(byte)node[0x10]);
    break;
  case (BaseNode)0x10:
    if ((builder->super_BaseEmitter)._emitterType == kCompiler) {
      EVar4 = formatLabel(sb,(FormatFlags)pFVar9,&builder->super_BaseEmitter,
                          *(uint32_t *)(node + 0x30));
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = String::_opString(sb,kAppend,": ",0xffffffffffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = formatFuncValuePack(sb,formatOptions->_flags,(BaseCompiler *)builder,
                                  (FuncValuePack *)(node + 0xc0),(RegOnly *)0x0);
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = String::_opString(sb,kAppend," Func(",0xffffffffffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = formatFuncArgs(sb,formatOptions->_flags,(BaseCompiler *)builder,
                             (FuncDetail *)(node + 0x34),*(ArgPack **)(node + 0x348));
      goto joined_r0x0011e5b5;
    }
    goto LAB_0011e664;
  case (BaseNode)0x11:
    EVar4 = String::_opString(sb,kAppend,"[FuncRet]",0xffffffffffffffff);
    if (EVar4 != 0) {
      return EVar4;
    }
    pcVar6 = " ";
    uVar11 = 0;
    bVar3 = true;
    do {
      bVar7 = bVar3;
      if ((byte)node[0x13] <= uVar11) {
        formatNode();
      }
      if (*(int *)(node + uVar11 * 0x10 + 0x40) != 0) {
        EVar4 = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
        if (EVar4 != 0) {
          return EVar4;
        }
        EVar4 = formatOperand(sb,formatOptions->_flags,&builder->super_BaseEmitter,
                              (builder->super_BaseEmitter)._environment._arch,
                              (Operand_ *)(node + uVar11 * 0x10 + 0x40));
        if (EVar4 != 0) {
          return EVar4;
        }
      }
      uVar11 = 1;
      pcVar6 = ", ";
      bVar3 = false;
    } while (bVar7);
    goto LAB_0011e664;
  }
  if (EVar4 == 0) {
LAB_0011e664:
    if (*(long *)(node + 0x28) != 0) {
      uVar1 = *(uint *)(formatOptions->_padding)._data;
      uVar5 = 0x2c;
      if ((short)uVar1 != 0) {
        uVar5 = uVar1;
      }
      uVar11 = (ulong)(byte)*sb;
      if (0x1e < uVar11) {
        uVar11 = *(ulong *)(sb + 8);
      }
      n = (ulong)(uVar5 & 0xffff) - (uVar11 - uVar10);
      if ((uVar11 - uVar10 <= (ulong)(uVar5 & 0xffff) && n != 0) &&
         (EVar4 = String::_opChars(sb,kAppend,' ',n), EVar4 != 0)) {
        return EVar4;
      }
      EVar4 = String::_opString(sb,kAppend,"; ",0xffffffffffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      EVar4 = String::_opString(sb,kAppend,*(char **)(node + 0x28),0xffffffffffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
    }
    EVar4 = 0;
  }
  return EVar4;
}

Assistant:

Error formatNode(
  String& sb,
  const FormatOptions& formatOptions,
  const BaseBuilder* builder,
  const BaseNode* node) noexcept {

  if (node->hasPosition() && formatOptions.hasFlag(FormatFlags::kPositions))
    ASMJIT_PROPAGATE(sb.appendFormat("<%05u> ", node->position()));

  size_t startLineIndex = sb.size();

  switch (node->type()) {
    case NodeType::kInst:
    case NodeType::kJump: {
      const InstNode* instNode = node->as<InstNode>();
      ASMJIT_PROPAGATE(builder->_funcs.formatInstruction(sb, formatOptions.flags(), builder,
        builder->arch(),
        instNode->baseInst(), instNode->operands(), instNode->opCount()));
      break;
    }

    case NodeType::kSection: {
      const SectionNode* sectionNode = node->as<SectionNode>();
      if (builder->_code->isSectionValid(sectionNode->id())) {
        const Section* section = builder->_code->sectionById(sectionNode->id());
        ASMJIT_PROPAGATE(sb.appendFormat(".section %s", section->name()));
      }
      break;
    }

    case NodeType::kLabel: {
      const LabelNode* labelNode = node->as<LabelNode>();
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, labelNode->labelId()));
      ASMJIT_PROPAGATE(sb.append(":"));
      break;
    }

    case NodeType::kAlign: {
      const AlignNode* alignNode = node->as<AlignNode>();
      ASMJIT_PROPAGATE(sb.appendFormat(".align %u (%s)",
        alignNode->alignment(),
        alignNode->alignMode() == AlignMode::kCode ? "code" : "data"));
      break;
    }

    case NodeType::kEmbedData: {
      const EmbedDataNode* embedNode = node->as<EmbedDataNode>();
      ASMJIT_PROPAGATE(sb.append('.'));
      ASMJIT_PROPAGATE(formatDataType(sb, formatOptions.flags(), builder->arch(), embedNode->typeId()));
      ASMJIT_PROPAGATE(sb.appendFormat(" {Count=%zu Repeat=%zu TotalSize=%zu}", embedNode->itemCount(), embedNode->repeatCount(), embedNode->dataSize()));
      break;
    }

    case NodeType::kEmbedLabel: {
      const EmbedLabelNode* embedNode = node->as<EmbedLabelNode>();
      ASMJIT_PROPAGATE(sb.append(".label "));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->labelId()));
      break;
    }

    case NodeType::kEmbedLabelDelta: {
      const EmbedLabelDeltaNode* embedNode = node->as<EmbedLabelDeltaNode>();
      ASMJIT_PROPAGATE(sb.append(".label ("));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->labelId()));
      ASMJIT_PROPAGATE(sb.append(" - "));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->baseLabelId()));
      ASMJIT_PROPAGATE(sb.append(")"));
      break;
    }

    case NodeType::kConstPool: {
      const ConstPoolNode* constPoolNode = node->as<ConstPoolNode>();
      ASMJIT_PROPAGATE(sb.appendFormat("[ConstPool Size=%zu Alignment=%zu]", constPoolNode->size(), constPoolNode->alignment()));
      break;
    };

    case NodeType::kComment: {
      const CommentNode* commentNode = node->as<CommentNode>();
      return sb.appendFormat("; %s", commentNode->inlineComment());
    }

    case NodeType::kSentinel: {
      const SentinelNode* sentinelNode = node->as<SentinelNode>();
      const char* sentinelName = nullptr;

      switch (sentinelNode->sentinelType()) {
        case SentinelType::kFuncEnd:
          sentinelName = "[FuncEnd]";
          break;

        default:
          sentinelName = "[Sentinel]";
          break;
      }

      ASMJIT_PROPAGATE(sb.append(sentinelName));
      break;
    }

#ifndef ASMJIT_NO_COMPILER
    case NodeType::kFunc: {
      const FuncNode* funcNode = node->as<FuncNode>();

      if (builder->isCompiler()) {
        ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, funcNode->labelId()));
        ASMJIT_PROPAGATE(sb.append(": "));

        ASMJIT_PROPAGATE(formatFuncRets(sb, formatOptions.flags(), static_cast<const BaseCompiler*>(builder), funcNode->detail()));
        ASMJIT_PROPAGATE(sb.append(" Func("));
        ASMJIT_PROPAGATE(formatFuncArgs(sb, formatOptions.flags(), static_cast<const BaseCompiler*>(builder), funcNode->detail(), funcNode->argPacks()));
        ASMJIT_PROPAGATE(sb.append(")"));
      }
      break;
    }

    case NodeType::kFuncRet: {
      const FuncRetNode* retNode = node->as<FuncRetNode>();
      ASMJIT_PROPAGATE(sb.append("[FuncRet]"));

      for (uint32_t i = 0; i < 2; i++) {
        const Operand_& op = retNode->op(i);
        if (!op.isNone()) {
          ASMJIT_PROPAGATE(sb.append(i == 0 ? " " : ", "));
          ASMJIT_PROPAGATE(formatOperand(sb, formatOptions.flags(), builder, builder->arch(), op));
        }
      }
      break;
    }

    case NodeType::kInvoke: {
      const InvokeNode* invokeNode = node->as<InvokeNode>();
      ASMJIT_PROPAGATE(builder->_funcs.formatInstruction(sb, formatOptions.flags(), builder,
        builder->arch(),
        invokeNode->baseInst(), invokeNode->operands(), invokeNode->opCount()));
      break;
    }
#endif

    default: {
      ASMJIT_PROPAGATE(sb.appendFormat("[UserNode:%u]", node->type()));
      break;
    }
  }

  if (node->hasInlineComment()) {
    size_t requiredPadding = paddingFromOptions(formatOptions, FormatPaddingGroup::kRegularLine);
    size_t currentPadding = sb.size() - startLineIndex;

    if (currentPadding < requiredPadding)
      ASMJIT_PROPAGATE(sb.appendChars(' ', requiredPadding - currentPadding));

    ASMJIT_PROPAGATE(sb.append("; "));
    ASMJIT_PROPAGATE(sb.append(node->inlineComment()));
  }

  return kErrorOk;
}